

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseAwaiter<unsigned_long> *
co_await<unsigned_long>
          (PromiseAwaiter<unsigned_long> *__return_storage_ptr__,Promise<unsigned_long> *promise)

{
  Promise<unsigned_long> *promise_00;
  PromiseNode local_20;
  Promise<unsigned_long> *promise_local;
  
  local_20.super_PromiseArenaMember.arena = (PromiseArena *)promise;
  promise_local = (Promise<unsigned_long> *)__return_storage_ptr__;
  promise_00 = kj::mv<kj::Promise<unsigned_long>>(promise);
  kj::_::PromiseNode::from<kj::Promise<unsigned_long>>(&local_20,promise_00);
  kj::_::PromiseAwaiter<unsigned_long>::PromiseAwaiter
            (__return_storage_ptr__,(OwnPromiseNode *)&local_20);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_20);
  return __return_storage_ptr__;
}

Assistant:

_::PromiseAwaiter<T> operator co_await(Promise<T>&& promise) {
  return _::PromiseAwaiter<T>(_::PromiseNode::from(kj::mv(promise)));
}